

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void spell_blanket(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  ushort uVar1;
  bool bVar2;
  char *txt;
  ROOM_AFFECT_DATA raf;
  AFFECT_DATA af;
  ROOM_AFFECT_DATA local_e0;
  AFFECT_DATA local_90;
  
  bVar2 = is_affected(ch,sn);
  if (bVar2) {
    txt = "You have not yet fully recovered from your last casting.\n\r";
    goto LAB_003118f8;
  }
  uVar1 = ch->in_room->sector_type;
  if (uVar1 < 0x12) {
    if ((0x20340U >> (uVar1 & 0x1f) & 1) != 0) {
      txt = "Blanket what??\n\r";
      goto LAB_003118f8;
    }
    if ((0x2400U >> (uVar1 & 0x1f) & 1) != 0) {
      txt = "Your magic is not powerful enough to create snow here.\n\r";
      goto LAB_003118f8;
    }
  }
  bVar2 = is_outside(ch);
  if (bVar2) {
    if (ch->in_room->area->temp != 0) {
      init_affect_room(&local_e0);
      local_e0.where = 0;
      local_e0.type = gsn_blanket;
      local_e0.aftype = 0;
      local_e0.duration = 0x18;
      local_e0.location = 3;
      local_e0.modifier = 0x13 - ch->in_room->sector_type;
      local_e0.end_fun = blanket_melt;
      local_e0.tick_fun = (RAFF_FUN *)0x0;
      local_e0.owner = ch;
      local_e0.level = (short)level;
      new_affect_to_room(ch->in_room,&local_e0);
      init_affect(&local_90);
      local_90.where = 0;
      local_90.type = gsn_blanket;
      local_90.aftype = 7;
      local_90.duration = 0x18;
      local_90.location = 0;
      local_90.modifier = 0;
      local_90.level = (short)level;
      affect_to_char(ch,&local_90);
      clear_tracks(ch->in_room);
      act("A sudden gust sweeps through, bearing heavy snowflakes that rapidly blanket the ground.",
          ch,(void *)0x0,(void *)0x0,4);
      return;
    }
    txt = "It is too hot to create even magical snow right now.\n\r";
  }
  else {
    txt = "No amount of concentration will make it snow indoors.\n\r";
  }
LAB_003118f8:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_blanket(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	ROOM_AFFECT_DATA raf;

	if (is_affected(ch, sn))
	{
		send_to_char("You have not yet fully recovered from your last casting.\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type
		&& (ch->in_room->sector_type == SECT_AIR
			|| ch->in_room->sector_type == SECT_WATER
			|| ch->in_room->sector_type == SECT_UNDERWATER
			|| ch->in_room->sector_type == SECT_VERTICAL))
	{
		send_to_char("Blanket what??\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type
		&& (ch->in_room->sector_type == SECT_BURNING
			|| ch->in_room->sector_type == SECT_DESERT))
	{		
		send_to_char("Your magic is not powerful enough to create snow here.\n\r", ch);
		return;
	}

	if (!is_outside(ch))
	{
		send_to_char("No amount of concentration will make it snow indoors.\n\r", ch);
		return;
	}

	if (ch->in_room->area->temp == Temperature::Hot)
	{
		send_to_char("It is too hot to create even magical snow right now.\n\r", ch);
		return;
	}

	init_affect_room(&raf);
	raf.where = TO_ROOM_AFFECTS;
	raf.type = gsn_blanket;
	raf.aftype = AFT_SPELL;
	raf.level = level;
	raf.duration = 24;
	raf.location = APPLY_ROOM_SECT;
	raf.modifier = SECT_SNOW - ch->in_room->sector_type;
	raf.owner = ch;
	raf.end_fun = blanket_melt;
	raf.tick_fun = nullptr;
	new_affect_to_room(ch->in_room, &raf);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_blanket;
	af.aftype = AFT_TIMER;
	af.level = level;
	af.duration = 24;
	af.location = 0;
	af.modifier = 0;
	affect_to_char(ch, &af);

	clear_tracks(ch->in_room);

	act("A sudden gust sweeps through, bearing heavy snowflakes that rapidly blanket the ground.", ch, 0, 0, TO_ALL);
}